

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor
          (ExternalSignerScriptPubKeyMan *this,WalletBatch *batch,
          unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *desc)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 uVar3;
  bool bVar4;
  uint uVar5;
  WalletBatch *this_00;
  runtime_error *this_01;
  allocator<char> *in_RDX;
  uint256 *in_RSI;
  shared_ptr<Descriptor> *in_RDI;
  long in_FS_OFFSET;
  int64_t creation_time;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  WalletDescriptor w_desc;
  WalletDescriptor *in_stack_fffffffffffffdf8;
  WalletDescriptor *in_stack_fffffffffffffe00;
  WalletDescriptor *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  uint256 *desc_id;
  char *in_stack_fffffffffffffe28;
  int32_t in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int32_t range_start;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_179 [2];
  string local_138 [32];
  undefined1 local_118 [12];
  uint in_stack_fffffffffffffef4;
  WalletBatch *in_stack_fffffffffffffef8;
  DescriptorScriptPubKeyMan *in_stack_ffffffffffffff00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffdf8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
             SUB41((uint)in_stack_fffffffffffffe18 >> 0x18,0));
  p_Var2 = (in_RDI->super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  uVar5 = (*p_Var2->_vptr__Sp_counted_base[4])(p_Var2,0x400000000);
  uVar3 = (undefined1)uVar5;
  if ((uVar5 & 1) == 0) {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
                  ,0x1b,
                  "bool wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch &, std::unique_ptr<Descriptor>)"
                 );
  }
  p_Var2 = (in_RDI->super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  uVar5 = (*p_Var2->_vptr__Sp_counted_base[4])(p_Var2,0x800000000);
  range_start = CONCAT13((char)uVar5,(int3)in_stack_fffffffffffffe34);
  if ((uVar5 & 1) == 0) {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
                  ,0x1c,
                  "bool wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch &, std::unique_ptr<Descriptor>)"
                 );
  }
  this_00 = (WalletBatch *)GetTime();
  std::shared_ptr<Descriptor>::shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
            (&in_stack_fffffffffffffdf8->descriptor,
             (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)0x33a43c);
  WalletDescriptor::WalletDescriptor
            ((WalletDescriptor *)
             CONCAT17(in_stack_fffffffffffffe4f,CONCAT16(uVar3,in_stack_fffffffffffffe48)),in_RDI,
             (uint64_t)in_RDX,range_start,in_stack_fffffffffffffe30,
             (int32_t)((ulong)this_00 >> 0x20));
  std::shared_ptr<Descriptor>::~shared_ptr(&in_stack_fffffffffffffdf8->descriptor);
  WalletDescriptor::operator=(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  desc_id = in_RSI;
  (*(code *)(in_RDI->super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[0x1a].
            _vptr_Descriptor)(local_118);
  bVar4 = WalletBatch::WriteDescriptor
                    (this_00,desc_id,
                     (WalletDescriptor *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    DescriptorScriptPubKeyMan::TopUpWithDB
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    p_Var2 = (in_RDI->super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (*p_Var2->_vptr__Sp_counted_base[5])(p_Var2,in_RSI);
    WalletDescriptor::~WalletDescriptor(in_stack_fffffffffffffdf8);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffdf8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else {
    uVar6 = 1;
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar6,CONCAT16(uVar3,in_stack_fffffffffffffe48)),(char *)in_RDI,in_RDX);
    std::operator+(__lhs,(char *)this_01);
    std::runtime_error::runtime_error(this_01,local_138);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch& batch, std::unique_ptr<Descriptor> desc)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));

    int64_t creation_time = GetTime();

    // Make the descriptor
    WalletDescriptor w_desc(std::move(desc), creation_time, 0, 0, 0);
    m_wallet_descriptor = w_desc;

    // Store the descriptor
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}